

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall Assimp::FlipUVsProcess::Execute(FlipUVsProcess *this,aiScene *pScene)

{
  Logger *pLVar1;
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  aiScene *pScene_local;
  FlipUVsProcess *this_local;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess begin");
  for (local_1c = 0; local_1c < pScene->mNumMeshes; local_1c = local_1c + 1) {
    ProcessMesh(this,pScene->mMeshes[local_1c]);
  }
  for (local_20 = 0; local_20 < pScene->mNumMaterials; local_20 = local_20 + 1) {
    ProcessMaterial(this,pScene->mMaterials[local_20]);
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"FlipUVsProcess finished");
  return;
}

Assistant:

void FlipUVsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FlipUVsProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        ProcessMesh(pScene->mMeshes[i]);

    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        ProcessMaterial(pScene->mMaterials[i]);
    ASSIMP_LOG_DEBUG("FlipUVsProcess finished");
}